

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

void http_parser_init(http_parser *parser,http_parser_type t)

{
  undefined8 uVar1;
  uint in_ESI;
  uint *in_RDI;
  void *data;
  int local_1c;
  
  uVar1 = *(undefined8 *)(in_RDI + 6);
  memset(in_RDI,0,0x20);
  *(undefined8 *)(in_RDI + 6) = uVar1;
  *in_RDI = *in_RDI & 0xfffffffc | in_ESI & 3;
  if (in_ESI == 0) {
    local_1c = 0x12;
  }
  else {
    local_1c = 2;
    if (in_ESI == 1) {
      local_1c = 4;
    }
  }
  *in_RDI = *in_RDI & 0xfffe03ff | local_1c << 10;
  in_RDI[5] = in_RDI[5] & 0x80ffffff;
  return;
}

Assistant:

void
http_parser_init (http_parser *parser, enum http_parser_type t)
{
  void *data = parser->data; /* preserve application data */
  memset(parser, 0, sizeof(*parser));
  parser->data = data;
  parser->type = t;
  parser->state = (t == HTTP_REQUEST ? s_start_req : (t == HTTP_RESPONSE ? s_start_res : s_start_req_or_res));
  parser->http_errno = HPE_OK;
}